

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O1

int re_matchp(re_t pattern,char *text)

{
  char *text_00;
  int iVar1;
  uint uVar2;
  long lVar3;
  
  if (pattern != (re_t)0x0) {
    if (pattern->type == '\x02') {
      iVar1 = matchpattern(pattern + 1,text);
      return iVar1 + -1;
    }
    lVar3 = 0;
    do {
      text_00 = text + lVar3;
      iVar1 = matchpattern(pattern,text_00);
      if (iVar1 != 0) {
        uVar2 = -(uint)(text[lVar3] == '\0') | (uint)lVar3;
        goto LAB_001137e4;
      }
      lVar3 = lVar3 + 1;
    } while (*text_00 != '\0');
    uVar2 = 0;
LAB_001137e4:
    if (iVar1 != 0) {
      return uVar2;
    }
  }
  return -1;
}

Assistant:

int re_matchp(re_t pattern, const char* text)
{
  if (pattern != 0)
  {
    if (pattern[0].type == BEGIN)
    {
      return ((matchpattern(&pattern[1], text)) ? 0 : -1);
    }
    else
    {
      int idx = -1;

      do
      {
        idx += 1;
        
        if (matchpattern(pattern, text))
        {
          if (text[0] == '\0')
            return -1;
        
          return idx;
        }
      }
      while (*text++ != '\0');
    }
  }
  return -1;
}